

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

void __thiscall Darts::Details::DoubleArrayBuilder::reserve_id(DoubleArrayBuilder *this,id_type id)

{
  id_type iVar1;
  uint uVar2;
  uint uVar3;
  DoubleArrayBuilderExtraUnit *pDVar4;
  ulong uVar5;
  
  if ((this->units_).size_ <= (ulong)id) {
    expand_units(this);
  }
  if (this->extras_head_ == id) {
    uVar5 = (ulong)(id & 0xfff);
    pDVar4 = (this->extras_).array_;
    iVar1 = pDVar4[uVar5].next_;
    this->extras_head_ = iVar1;
    if (iVar1 == id) {
      this->extras_head_ = (id_type)(this->units_).size_;
    }
  }
  else {
    pDVar4 = (this->extras_).array_;
    uVar5 = (ulong)(id & 0xfff);
  }
  uVar2 = pDVar4[uVar5].prev_;
  uVar3 = pDVar4[uVar5].next_;
  pDVar4[(ulong)uVar2 & 0xfff].next_ = uVar3;
  pDVar4[(ulong)uVar3 & 0xfff].prev_ = uVar2;
  pDVar4[uVar5].is_fixed_ = true;
  return;
}

Assistant:

inline void DoubleArrayBuilder::reserve_id(id_type id) {
  if (id >= units_.size()) {
    expand_units();
  }

  if (id == extras_head_) {
    extras_head_ = extras(id).next();
    if (extras_head_ == id) {
      extras_head_ = units_.size();
    }
  }
  extras(extras(id).prev()).set_next(extras(id).next());
  extras(extras(id).next()).set_prev(extras(id).prev());
  extras(id).set_is_fixed(true);
}